

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

bool __thiscall
docopt::LeafPattern::match
          (LeafPattern *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  Kind KVar1;
  LeafPattern *pLVar2;
  element_type *peVar3;
  element_type *peVar4;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  _Var5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> match;
  undefined1 local_e0 [8];
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  long local_a0;
  value_type local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_Pattern)._vptr_Pattern[8])(&local_a0,this,left);
  peVar3 = local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) goto LAB_0012b70a;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::_M_erase(left,(left->
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_a0);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::LeafPattern>*,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,__gnu_cxx::__ops::_Iter_pred<docopt::LeafPattern::match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&)const::_lambda(std::shared_ptr<docopt::LeafPattern>const&)_1_>>
                    ((collected->
                     super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (collected->
                     super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,this);
  peVar4 = local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  KVar1 = (this->fValue).kind_;
  if (KVar1 == StringList) {
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = 0;
    local_a8 = 0;
    KVar1 = ((local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            fValue).kind_;
    if (KVar1 == StringList) {
      value::throwIfNotKind
                (&(local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->fValue,StringList);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,&(peVar4->fValue).variant_.strList);
    }
    else if (KVar1 == String) {
      value::throwIfNotKind
                (&(local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->fValue,String);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,&(peVar4->fValue).variant_.strValue);
    }
    if (_Var5._M_current ==
        (collected->
        super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::push_back(collected,&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b8);
      local_e0._0_4_ = StringList;
      local_d8._0_8_ =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8._8_8_ =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_d8._16_8_ =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      setValue(local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (value *)local_e0);
      if (local_e0._0_4_ == StringList) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
      }
      else if ((local_e0._0_4_ == String) && ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10))
              ) {
        operator_delete((void *)local_d8._0_8_);
      }
      this_00 = &local_48;
    }
    else {
      pLVar2 = ((_Var5._M_current)->
               super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((pLVar2->fValue).kind_ == StringList) {
        value::throwIfNotKind(&pLVar2->fValue,StringList);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   local_b8._M_allocated_capacity,(pLVar2->fValue).variant_.longValue,
                   (pLVar2->fValue).variant_.strValue._M_string_length);
        pLVar2 = ((_Var5._M_current)->
                 super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_b8);
        local_e0._0_4_ = StringList;
        local_d8._0_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_d8._8_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_d8._16_8_ =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        setValue(pLVar2,(value *)local_e0);
        if (local_e0._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
        else if ((local_e0._0_4_ == String) &&
                ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10))) {
          operator_delete((void *)local_d8._0_8_);
        }
        this_00 = &local_68;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_b8);
        local_e0._0_4_ = StringList;
        local_d8._0_8_ =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_d8._8_8_ =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_d8._16_8_ =
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        setValue(pLVar2,(value *)local_e0);
        if (local_e0._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
        else if ((local_e0._0_4_ == String) &&
                ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10))) {
          operator_delete((void *)local_d8._0_8_);
        }
        this_00 = &local_88;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    this_01 = &local_b8;
  }
  else {
    if (KVar1 != Long) {
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::push_back(collected,&local_98);
      goto LAB_0012b70a;
    }
    if (_Var5._M_current ==
        (collected->
        super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::push_back(collected,&local_98);
LAB_0012b48c:
      local_d8._0_8_ = (undefined1 *)0x1;
    }
    else {
      local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((_Var5._M_current)->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
      if (((local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          fValue).kind_ != Long) goto LAB_0012b48c;
      lVar6 = value::asLong(&(local_98.
                              super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->fValue);
      local_d8._0_8_ = lVar6 + 1;
      local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((_Var5._M_current)->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
    }
    local_e0._0_4_ = Long;
    setValue(local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (value *)local_e0);
    if (local_e0._0_4_ != StringList) {
      if ((local_e0._0_4_ == String) && ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10))) {
        operator_delete((void *)local_d8._0_8_);
      }
      goto LAB_0012b70a;
    }
    this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
LAB_0012b70a:
  if (local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return peVar3 != (element_type *)0x0;
}

Assistant:

inline bool LeafPattern::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		auto match = single_match(left);
		if (!match.second) {
			return false;
		}

		left.erase(left.begin()+static_cast<std::ptrdiff_t>(match.first));

		auto same_name = std::find_if(collected.begin(), collected.end(), [&](std::shared_ptr<LeafPattern> const& p) {
			return p->name()==name();
		});
		if (getValue().isLong()) {
			long val = 1;
			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isLong()) {
				val += (**same_name).getValue().asLong();
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else if (getValue().isStringList()) {
			std::vector<std::string> val;
			if (match.second->getValue().isString()) {
				val.push_back(match.second->getValue().asString());
			} else if (match.second->getValue().isStringList()) {
				val = match.second->getValue().asStringList();
			} else {
				/// cant be!?
			}

			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isStringList()) {
				std::vector<std::string> const& list = (**same_name).getValue().asStringList();
				val.insert(val.begin(), list.begin(), list.end());
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else {
			collected.push_back(match.second);
		}
		return true;
	}